

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O2

int av1_selfguided_restoration_avx2
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  int32_t *dest;
  long lVar1;
  int32_t iVar2;
  undefined1 auVar3 [16];
  __m256i sum2;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int j_4;
  int iVar11;
  int iVar12;
  void *memblk;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int n;
  int stride;
  int n_00;
  int stride_00;
  long lVar19;
  undefined1 (*pauVar20) [32];
  long extraout_RDX;
  long lVar21;
  ulong extraout_RDX_00;
  ulong uVar22;
  int r;
  uint8_t *puVar23;
  long lVar24;
  __m256i *palVar25;
  __m256i *palVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int j_2;
  uint uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  longlong *__return_storage_ptr__;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  __m256i alVar39;
  __m256i alVar40;
  __m256i alVar41;
  undefined1 auVar42 [64];
  __m256i alVar43;
  __m256i alVar44;
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  __m256i zero;
  int32_t *dest_00;
  undefined4 uVar54;
  undefined4 uVar55;
  longlong *plVar56;
  int32_t *local_248;
  undefined1 local_1c0 [32];
  undefined1 local_180 [32];
  longlong local_160 [38];
  int32_t *buf;
  
  auVar46 = in_ZMM2._0_16_;
  memblk = aom_memalign(0x20,0x1fa80);
  if (memblk == (void *)0x0) {
    iVar18 = -1;
  }
  else {
    iVar18 = width + 6;
    uVar55 = 0;
    uVar30 = height + 6;
    uVar33 = width + 0x1dU & 0xfffffff8;
    buf = (int32_t *)(ulong)uVar33;
    dest = (int32_t *)((long)memblk + 0xfd5c);
    dest_00 = (int32_t *)((long)memblk + 0x17bfc);
    lVar16 = (long)(int)uVar33;
    puVar23 = dgd8 + (dgd_stride * -3 + -3);
    uVar54 = 0;
    if (highbd == 0) {
      local_160[0] = 0;
      local_160[1] = 0;
      local_160[2] = 0;
      local_160[3] = 0;
      iVar11 = width + 0xe;
      auVar48 = ZEXT1664(auVar46);
      memset_zero_avx(dest,(__m256i *)local_160,(long)iVar11);
      memset_zero_avx(dest_00,(__m256i *)local_160,(long)iVar11);
      uVar13 = 0;
      uVar17 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar17 = uVar13;
      }
      lVar24 = (long)memblk + lVar16 * 4 + 0x17c00;
      lVar19 = (long)memblk + 0x17c00;
      while (uVar13 != uVar17) {
        uVar13 = uVar13 + 1;
        dest_00[uVar13 * lVar16] = 0;
        dest[uVar13 * lVar16] = 0;
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        for (lVar27 = 0; lVar27 < iVar18; lVar27 = lVar27 + 8) {
          auVar38 = *(undefined1 (*) [32])(lVar19 + lVar27 * 4);
          auVar48 = ZEXT3264(auVar38);
          auVar37 = *(undefined1 (*) [32])(lVar19 + -0x7ea0 + lVar27 * 4);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(puVar23 + lVar27);
          auVar47 = vpmovzxbd_avx2(auVar46);
          auVar36 = vpmaddwd_avx2(auVar47,auVar47);
          auVar49 = vpslldq_avx2(auVar47,4);
          auVar47 = vpaddd_avx2(auVar49,auVar47);
          auVar49 = vpslldq_avx2(auVar47,8);
          auVar47 = vpaddd_avx2(auVar47,auVar49);
          auVar46 = vpshufd_avx(auVar47._0_16_,0xff);
          auVar51._16_16_ = ZEXT116(1) * auVar46;
          auVar51._0_16_ = ZEXT116(0) * auVar46;
          auVar49 = vpslldq_avx2(auVar36,4);
          auVar36 = vpaddd_avx2(auVar36,auVar49);
          auVar49 = vpslldq_avx2(auVar36,8);
          auVar36 = vpaddd_avx2(auVar36,auVar49);
          auVar46 = vpshufd_avx(auVar36._0_16_,0xff);
          auVar53._16_16_ = ZEXT116(1) * auVar46;
          auVar53._0_16_ = ZEXT116(0) * auVar46;
          auVar49 = vpaddd_avx2(auVar38,auVar45._0_32_);
          auVar47 = vpaddd_avx2(auVar49,auVar47);
          auVar47 = vpaddd_avx2(auVar47,auVar51);
          auVar49 = vpaddd_avx2(auVar37,auVar42._0_32_);
          auVar36 = vpaddd_avx2(auVar49,auVar36);
          auVar36 = vpaddd_avx2(auVar36,auVar53);
          *(undefined1 (*) [32])(lVar24 + lVar27 * 4) = auVar47;
          *(undefined1 (*) [32])(lVar24 + -0x7ea0 + lVar27 * 4) = auVar36;
          auVar38 = vpsubd_avx2(auVar47,auVar38);
          auVar38 = vpshufd_avx2(auVar38,0xff);
          auVar38 = vpermq_avx2(auVar38,0xaa);
          auVar45 = ZEXT3264(auVar38);
          auVar38 = vpsubd_avx2(auVar36,auVar37);
          auVar38 = vpshufd_avx2(auVar38,0xff);
          auVar38 = vpermq_avx2(auVar38,0xaa);
          auVar42 = ZEXT3264(auVar38);
        }
        puVar23 = puVar23 + dgd_stride;
        lVar24 = lVar24 + lVar16 * 4;
        lVar19 = lVar19 + lVar16 * 4;
      }
    }
    else {
      lVar24 = (long)puVar23 * 2;
      local_160[0] = 0;
      local_160[1] = 0;
      local_160[2] = 0;
      local_160[3] = 0;
      iVar11 = width + 0xe;
      auVar48 = ZEXT1664(auVar46);
      memset_zero_avx(dest,(__m256i *)local_160,(long)iVar11);
      memset_zero_avx(dest_00,(__m256i *)local_160,(long)iVar11);
      uVar13 = 0;
      uVar17 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar17 = uVar13;
      }
      lVar19 = (long)memblk + lVar16 * 4 + 0x17c00;
      lVar27 = (long)memblk + 0x17c00;
      while (uVar13 != uVar17) {
        uVar13 = uVar13 + 1;
        dest_00[uVar13 * lVar16] = 0;
        dest[uVar13 * lVar16] = 0;
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        for (lVar29 = 0; lVar29 < iVar18; lVar29 = lVar29 + 8) {
          auVar38 = *(undefined1 (*) [32])(lVar27 + lVar29 * 4);
          auVar48 = ZEXT3264(auVar38);
          auVar37 = *(undefined1 (*) [32])(lVar27 + -0x7ea0 + lVar29 * 4);
          auVar47 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar24 + lVar29 * 2));
          auVar36 = vpmaddwd_avx2(auVar47,auVar47);
          auVar49 = vpslldq_avx2(auVar47,4);
          auVar47 = vpaddd_avx2(auVar49,auVar47);
          auVar49 = vpslldq_avx2(auVar47,8);
          auVar47 = vpaddd_avx2(auVar47,auVar49);
          auVar46 = vpshufd_avx(auVar47._0_16_,0xff);
          auVar50._16_16_ = ZEXT116(1) * auVar46;
          auVar50._0_16_ = ZEXT116(0) * auVar46;
          auVar49 = vpslldq_avx2(auVar36,4);
          auVar36 = vpaddd_avx2(auVar36,auVar49);
          auVar49 = vpslldq_avx2(auVar36,8);
          auVar36 = vpaddd_avx2(auVar36,auVar49);
          auVar46 = vpshufd_avx(auVar36._0_16_,0xff);
          auVar52._16_16_ = ZEXT116(1) * auVar46;
          auVar52._0_16_ = ZEXT116(0) * auVar46;
          auVar49 = vpaddd_avx2(auVar38,auVar45._0_32_);
          auVar47 = vpaddd_avx2(auVar49,auVar47);
          auVar47 = vpaddd_avx2(auVar47,auVar50);
          auVar49 = vpaddd_avx2(auVar37,auVar42._0_32_);
          auVar36 = vpaddd_avx2(auVar49,auVar36);
          auVar36 = vpaddd_avx2(auVar36,auVar52);
          *(undefined1 (*) [32])(lVar19 + lVar29 * 4) = auVar47;
          *(undefined1 (*) [32])(lVar19 + -0x7ea0 + lVar29 * 4) = auVar36;
          auVar38 = vpsubd_avx2(auVar47,auVar38);
          auVar38 = vpshufd_avx2(auVar38,0xff);
          auVar38 = vpermq_avx2(auVar38,0xaa);
          auVar45 = ZEXT3264(auVar38);
          auVar38 = vpsubd_avx2(auVar36,auVar37);
          auVar38 = vpshufd_avx2(auVar38,0xff);
          auVar38 = vpermq_avx2(auVar38,0xaa);
          auVar42 = ZEXT3264(auVar38);
        }
        lVar24 = lVar24 + (long)dgd_stride * 2;
        lVar19 = lVar19 + lVar16 * 4;
        lVar27 = lVar27 + lVar16 * 4;
      }
    }
    lVar19 = (long)sgr_params_idx;
    iVar18 = av1_sgr_params[lVar19].r[0];
    lVar27 = (long)width;
    lVar29 = (long)height;
    lVar14 = (long)(int)(uVar33 * 3);
    bVar15 = (byte)highbd;
    lVar24 = lVar16;
    if (0 < iVar18) {
      iVar11 = iVar18 * 2 + 1;
      iVar11 = iVar11 * iVar11;
      iVar35 = av1_sgr_params[lVar19].s[0];
      local_180._4_4_ = av1_one_by_x[iVar11 - 1];
      uVar17 = (ulong)(uint)local_180._4_4_;
      pauVar20 = (undefined1 (*) [32])local_160;
      lVar28 = 0x40;
      auVar46 = vpmovsxbq_avx(ZEXT216(0xff));
      for (; lVar28 != 0; lVar28 = lVar28 + -8) {
        auVar3 = vpsrlq_avx(auVar46,ZEXT416((uint)lVar28));
        auVar38 = vpmovsxbd_avx2(auVar3);
        *pauVar20 = auVar38;
        pauVar20 = pauVar20 + 1;
      }
      local_180._0_4_ = local_180._4_4_;
      local_180._8_4_ = local_180._4_4_;
      local_180._12_4_ = local_180._4_4_;
      local_180._16_4_ = local_180._4_4_;
      local_180._20_4_ = local_180._4_4_;
      local_180._24_4_ = local_180._4_4_;
      local_180._28_4_ = local_180._4_4_;
      __return_storage_ptr__ = (longlong *)((long)memblk + lVar14 * 4 + 0xfd68);
      iVar12 = width + 2;
      local_1c0._8_4_ = 0xff;
      local_1c0._0_8_ = 0xff000000ff;
      local_1c0._12_4_ = 0xff;
      local_1c0._16_4_ = 0xff;
      local_1c0._20_4_ = 0xff;
      local_1c0._24_4_ = 0xff;
      local_1c0._28_4_ = 0xff;
      auVar38._8_4_ = 0x800;
      auVar38._0_8_ = 0x80000000800;
      auVar38._12_4_ = 0x800;
      auVar38._16_4_ = 0x800;
      auVar38._20_4_ = 0x800;
      auVar38._24_4_ = 0x800;
      auVar38._28_4_ = 0x800;
      auVar42 = ZEXT3264(auVar38);
      for (lVar28 = -1; lVar28 <= lVar29; lVar28 = lVar28 + 2) {
        lVar31 = -1;
        iVar34 = iVar12;
        plVar56 = __return_storage_ptr__;
        while( true ) {
          auVar47 = auVar48._0_32_;
          auVar37 = auVar42._0_32_;
          if (lVar27 < lVar31) break;
          boxsum_from_ii((__m256i *)((long)__return_storage_ptr__ + 0x7ea0),(int32_t *)(ulong)uVar33
                         ,iVar18,(int)uVar17);
          auVar36 = auVar37;
          boxsum_from_ii((__m256i *)__return_storage_ptr__,buf,iVar18,(int)uVar17);
          if (iVar34 < 8) {
            auVar37 = vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar34 * 4),auVar37);
            vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar34 * 4),auVar36);
            auVar47 = auVar37;
          }
          alVar43[1] = lVar27;
          alVar43[0] = lVar24;
          alVar43[2] = (longlong)memblk;
          alVar43[3] = (longlong)flt0;
          alVar44[0]._4_4_ = uVar54;
          alVar44[0]._0_4_ = width;
          alVar44[1]._0_4_ = height;
          alVar44[1]._4_4_ = uVar55;
          alVar44[2] = (longlong)plVar56;
          alVar44[3] = lVar14;
          auVar49 = auVar37;
          compute_p((__m256i *)(ulong)(uint)bit_depth,alVar43,alVar44,iVar11,n);
          auVar36._4_4_ = iVar35;
          auVar36._0_4_ = iVar35;
          auVar36._8_4_ = iVar35;
          auVar36._12_4_ = iVar35;
          auVar36._16_4_ = iVar35;
          auVar36._20_4_ = iVar35;
          auVar36._24_4_ = iVar35;
          auVar36._28_4_ = iVar35;
          auVar36 = vpmulld_avx2(auVar49,auVar36);
          auVar49._8_4_ = 0x80000;
          auVar49._0_8_ = 0x8000000080000;
          auVar49._12_4_ = 0x80000;
          auVar49._16_4_ = 0x80000;
          auVar49._20_4_ = 0x80000;
          auVar49._24_4_ = 0x80000;
          auVar49._28_4_ = 0x80000;
          auVar36 = vpaddd_avx2(auVar36,auVar49);
          auVar36 = vpsrld_avx2(auVar36,0x14);
          vpminud_avx2(auVar36,local_1c0);
          auVar47 = vpcmpeqd_avx2(auVar47,auVar47);
          alVar43 = (__m256i)vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar47);
          auVar48 = ZEXT3264((undefined1  [32])0x0);
          *(__m256i *)((long)__return_storage_ptr__ + -0xfd40) = alVar43;
          auVar47._8_4_ = 0x100;
          auVar47._0_8_ = 0x10000000100;
          auVar47._12_4_ = 0x100;
          auVar47._16_4_ = 0x100;
          auVar47._20_4_ = 0x100;
          auVar47._24_4_ = 0x100;
          auVar47._28_4_ = 0x100;
          auVar47 = vpsubd_avx2(auVar47,(undefined1  [32])alVar43);
          auVar47 = vpmaddwd_avx2(auVar47,local_180);
          auVar37 = vpmulld_avx2(auVar47,auVar37);
          auVar37 = vpaddd_avx2(auVar37,auVar38);
          alVar43 = (__m256i)vpsrld_avx2(auVar37,0xc);
          auVar42 = ZEXT3264((undefined1  [32])alVar43);
          *(__m256i *)((long)__return_storage_ptr__ + -0x7ea0) = alVar43;
          lVar31 = lVar31 + 8;
          __return_storage_ptr__ = (longlong *)((long)__return_storage_ptr__ + 0x20);
          iVar34 = iVar34 + -8;
        }
        __return_storage_ptr__ = *(__m256i *)plVar56 + lVar16;
      }
      puVar23 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar23 = dgd8;
      }
      lVar16 = 0;
      uVar17 = 0;
      if (0 < height) {
        uVar17 = (ulong)(uint)height;
      }
      lVar31 = (long)flt_stride * 4;
      lVar1 = lVar24 * 4;
      lVar28 = lVar1 + lVar14 * 4;
      lVar21 = (long)memblk + lVar28 + 0x7ed0;
      palVar25 = (__m256i *)((long)memblk + lVar28 + 0x7ecc);
      auVar37._8_4_ = 0x80;
      auVar37._0_8_ = 0x8000000080;
      auVar37._12_4_ = 0x80;
      auVar37._16_4_ = 0x80;
      auVar37._20_4_ = 0x80;
      auVar37._24_4_ = 0x80;
      auVar37._28_4_ = 0x80;
      auVar42 = ZEXT3264(auVar37);
      lVar28 = lVar21;
      for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
        if ((uVar13 & 1) == 0) {
          palVar26 = palVar25;
          for (lVar32 = 0; auVar38 = auVar42._0_32_, lVar32 < lVar27; lVar32 = lVar32 + 8) {
            cross_sum_fast_even_row(palVar26 + -0x3f5,buf,(int)lVar21);
            auVar47 = auVar38;
            cross_sum_fast_even_row(palVar26,buf,stride);
            if (highbd == 0) {
              auVar36 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                        (puVar23 + ((int)lVar16 + (int)lVar32 << (bVar15 & 0x1f))));
            }
            else {
              auVar36 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                        (puVar23 + ((int)lVar16 + (int)lVar32 << (bVar15 & 0x1f))));
            }
            auVar36 = vpmaddwd_avx2(auVar36,auVar38);
            auVar7._8_4_ = 0x100;
            auVar7._0_8_ = 0x10000000100;
            auVar7._12_4_ = 0x100;
            auVar7._16_4_ = 0x100;
            auVar7._20_4_ = 0x100;
            auVar7._24_4_ = 0x100;
            auVar7._28_4_ = 0x100;
            auVar38 = vpaddd_avx2(auVar47,auVar7);
            auVar38 = vpaddd_avx2(auVar38,auVar36);
            auVar38 = vpsrad_avx2(auVar38,9);
            auVar42 = ZEXT3264(auVar38);
            *(undefined1 (*) [32])(flt0 + lVar32) = auVar38;
            palVar26 = palVar26 + 1;
            lVar21 = extraout_RDX;
          }
        }
        else {
          for (lVar32 = 0; lVar32 < lVar27; lVar32 = lVar32 + 8) {
            lVar21 = (long)((int)lVar16 + (int)lVar32 << (bVar15 & 0x1f));
            if (highbd == 0) {
              auVar38 = vpmovzxbd_avx2(*(undefined1 (*) [16])(puVar23 + lVar21));
            }
            else {
              auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(puVar23 + lVar21));
            }
            auVar47 = *(undefined1 (*) [32])(lVar28 + -0x7ea4 + lVar32 * 4);
            auVar36 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])(lVar28 + -0x7ea8 + lVar32 * 4));
            auVar36 = vpaddd_avx2(auVar36,*(undefined1 (*) [32])(lVar28 + -0x7ea0 + lVar32 * 4));
            auVar5._8_4_ = 5;
            auVar5._0_8_ = 0x500000005;
            auVar5._12_4_ = 5;
            auVar5._16_4_ = 5;
            auVar5._20_4_ = 5;
            auVar5._24_4_ = 5;
            auVar5._28_4_ = 5;
            auVar36 = vpmulld_avx2(auVar36,auVar5);
            auVar36 = vpaddd_avx2(auVar36,auVar47);
            auVar47 = *(undefined1 (*) [32])(lVar28 + -4 + lVar32 * 4);
            auVar48 = ZEXT3264(auVar47);
            auVar49 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])(lVar28 + -8 + lVar32 * 4));
            auVar49 = vpaddd_avx2(auVar49,*(undefined1 (*) [32])(lVar28 + lVar32 * 4));
            auVar36 = vpmaddwd_avx2(auVar36,auVar38);
            auVar38 = vpmulld_avx2(auVar49,auVar5);
            auVar38 = vpaddd_avx2(auVar47,auVar38);
            auVar38 = vpaddd_avx2(auVar38,auVar37);
            auVar38 = vpaddd_avx2(auVar38,auVar36);
            auVar38 = vpsrad_avx2(auVar38,8);
            auVar42 = ZEXT3264(auVar38);
            *(undefined1 (*) [32])(flt0 + lVar32) = auVar38;
          }
        }
        flt0 = (int32_t *)((long)flt0 + lVar31);
        lVar16 = lVar16 + (ulong)(uint)dgd_stride;
        lVar28 = lVar28 + lVar1;
        palVar25 = (__m256i *)((long)*palVar25 + lVar1);
      }
    }
    iVar18 = av1_sgr_params[lVar19].r[1];
    if (0 < iVar18) {
      lVar16 = 0x40;
      iVar11 = iVar18 * 2 + 1;
      uVar33 = iVar11 * iVar11;
      uVar13 = (ulong)uVar33;
      uVar30 = av1_sgr_params[lVar19].s[1];
      uVar17 = (ulong)uVar30;
      iVar2 = av1_one_by_x[uVar33 - 1];
      pauVar20 = (undefined1 (*) [32])local_160;
      auVar46 = vpmovsxbq_avx(ZEXT216(0xff));
      for (; lVar16 != 0; lVar16 = lVar16 + -8) {
        auVar3 = vpsrlq_avx(auVar46,ZEXT416((uint)lVar16));
        auVar38 = vpmovsxbd_avx2(auVar3);
        *pauVar20 = auVar38;
        pauVar20 = pauVar20 + 1;
      }
      palVar25 = (__m256i *)((long)memblk + lVar14 * 4 + 0xfd68);
      lVar24 = lVar24 << 2;
      iVar11 = width + 2;
      local_180._8_4_ = 0x80000;
      local_180._0_8_ = 0x8000000080000;
      local_180._12_4_ = 0x80000;
      local_180._16_4_ = 0x80000;
      local_180._20_4_ = 0x80000;
      local_180._24_4_ = 0x80000;
      local_180._28_4_ = 0x80000;
      alVar39[1]._0_4_ = 0x800;
      alVar39[0] = 0x80000000800;
      alVar39[1]._4_4_ = 0x800;
      alVar39[2]._0_4_ = 0x800;
      alVar39[2]._4_4_ = 0x800;
      alVar39[3]._0_4_ = 0x800;
      alVar39[3]._4_4_ = 0x800;
      uVar54 = 0;
      alVar43 = alVar39;
      for (lVar16 = -1; lVar16 <= lVar29; lVar16 = lVar16 + 1) {
        palVar26 = palVar25;
        iVar35 = iVar11;
        for (lVar19 = -1; alVar44 = auVar48._0_32_, lVar19 <= lVar27; lVar19 = lVar19 + 8) {
          boxsum_from_ii(palVar26 + 0x3f5,buf,iVar18,(int)uVar17);
          alVar40 = alVar43;
          boxsum_from_ii(palVar26,buf,iVar18,(int)uVar17);
          if (iVar35 < 8) {
            alVar43 = (__m256i)vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar35 * 4),
                                          (undefined1  [32])alVar43);
            vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar35 * 4),
                       (undefined1  [32])alVar40);
            alVar44 = alVar43;
          }
          alVar40[1] = lVar27;
          alVar40[0] = lVar24;
          alVar40[2] = (longlong)memblk;
          alVar40[3] = uVar13;
          sum2[0]._4_4_ = uVar54;
          sum2[0]._0_4_ = iVar11;
          sum2[1]._0_4_ = height;
          sum2[1]._4_4_ = uVar55;
          sum2[2] = lVar16;
          sum2[3] = lVar14;
          alVar41 = alVar43;
          compute_p((__m256i *)(ulong)(uint)bit_depth,alVar40,sum2,(int)uVar13,n_00);
          auVar4._4_4_ = uVar30;
          auVar4._0_4_ = uVar30;
          auVar4._8_4_ = uVar30;
          auVar4._12_4_ = uVar30;
          auVar4._16_4_ = uVar30;
          auVar4._20_4_ = uVar30;
          auVar4._24_4_ = uVar30;
          auVar4._28_4_ = uVar30;
          auVar38 = vpmulld_avx2((undefined1  [32])alVar41,auVar4);
          auVar38 = vpaddd_avx2(auVar38,local_180);
          auVar38 = vpsrld_avx2(auVar38,0x14);
          auVar10._8_4_ = 0xff;
          auVar10._0_8_ = 0xff000000ff;
          auVar10._12_4_ = 0xff;
          auVar10._16_4_ = 0xff;
          auVar10._20_4_ = 0xff;
          auVar10._24_4_ = 0xff;
          auVar10._28_4_ = 0xff;
          vpminud_avx2(auVar38,auVar10);
          auVar38 = vpcmpeqd_avx2((undefined1  [32])alVar44,(undefined1  [32])alVar44);
          alVar44 = (__m256i)vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
          auVar48 = ZEXT3264((undefined1  [32])0x0);
          palVar26[-0x7ea] = alVar44;
          auVar8._8_4_ = 0x100;
          auVar8._0_8_ = 0x10000000100;
          auVar8._12_4_ = 0x100;
          auVar8._16_4_ = 0x100;
          auVar8._20_4_ = 0x100;
          auVar8._24_4_ = 0x100;
          auVar8._28_4_ = 0x100;
          auVar38 = vpsubd_avx2(auVar8,(undefined1  [32])alVar44);
          auVar6._4_4_ = iVar2;
          auVar6._0_4_ = iVar2;
          auVar6._8_4_ = iVar2;
          auVar6._12_4_ = iVar2;
          auVar6._16_4_ = iVar2;
          auVar6._20_4_ = iVar2;
          auVar6._24_4_ = iVar2;
          auVar6._28_4_ = iVar2;
          auVar38 = vpmaddwd_avx2(auVar38,auVar6);
          auVar38 = vpmulld_avx2(auVar38,(undefined1  [32])alVar43);
          auVar38 = vpaddd_avx2(auVar38,(undefined1  [32])alVar39);
          alVar43 = (__m256i)vpsrld_avx2(auVar38,0xc);
          palVar26[-0x3f5] = alVar43;
          palVar26 = palVar26 + 1;
          iVar35 = iVar35 + -8;
        }
        palVar25 = (__m256i *)((long)*palVar25 + lVar24);
      }
      puVar23 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar23 = dgd8;
      }
      uVar13 = 0;
      uVar17 = (ulong)(uint)height;
      if (height < 1) {
        uVar17 = uVar13;
      }
      palVar25 = (__m256i *)((long)memblk + lVar24 + lVar14 * 4 + 0x7ecc);
      uVar55 = (undefined4)uVar17;
      uVar54 = 0;
      local_248 = flt1;
      for (uVar22 = 0; uVar22 != uVar17; uVar22 = uVar22 + 1) {
        uVar17 = uVar22;
        palVar26 = palVar25;
        for (lVar16 = 0; lVar16 < lVar27; lVar16 = lVar16 + 8) {
          cross_sum(palVar25 + -0x3f5,buf,(int)uVar17);
          alVar44 = alVar43;
          cross_sum(palVar25,buf,stride_00);
          if (highbd == 0) {
            auVar38 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                      (puVar23 + ((int)uVar13 + (int)lVar16 << (bVar15 & 0x1f))));
          }
          else {
            auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                      (puVar23 + ((int)uVar13 + (int)lVar16 << (bVar15 & 0x1f))));
          }
          auVar37 = vpmaddwd_avx2(auVar38,(undefined1  [32])alVar43);
          auVar9._8_4_ = 0x100;
          auVar9._0_8_ = 0x10000000100;
          auVar9._12_4_ = 0x100;
          auVar9._16_4_ = 0x100;
          auVar9._20_4_ = 0x100;
          auVar9._24_4_ = 0x100;
          auVar9._28_4_ = 0x100;
          auVar38 = vpaddd_avx2((undefined1  [32])alVar44,auVar9);
          auVar38 = vpaddd_avx2(auVar38,auVar37);
          alVar43 = (__m256i)vpsrad_avx2(auVar38,9);
          *(__m256i *)(local_248 + lVar16) = alVar43;
          palVar25 = palVar25 + 1;
          uVar17 = extraout_RDX_00;
        }
        local_248 = local_248 + flt_stride;
        uVar13 = uVar13 + (uint)dgd_stride;
        palVar25 = (__m256i *)((long)*palVar26 + lVar24);
        uVar17 = CONCAT44(uVar54,uVar55);
      }
    }
    aom_free(memblk);
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int av1_selfguided_restoration_avx2(const uint8_t *dgd8, int width, int height,
                                    int dgd_stride, int32_t *flt0,
                                    int32_t *flt1, int flt_stride,
                                    int sgr_params_idx, int bit_depth,
                                    int highbd) {
  // The ALIGN_POWER_OF_TWO macro here ensures that column 1 of Atl, Btl,
  // Ctl and Dtl is 32-byte aligned.
  const int buf_elts = ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3);

  int32_t *buf = aom_memalign(
      32, 4 * sizeof(*buf) * ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3));
  if (!buf) return -1;

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 32 bytes for efficiency.
  int buf_stride = ALIGN_POWER_OF_TWO(width_ext + 16, 3);

  // The "tl" pointers point at the top-left of the initialised data for the
  // array.
  int32_t *Atl = buf + 0 * buf_elts + 7;
  int32_t *Btl = buf + 1 * buf_elts + 7;
  int32_t *Ctl = buf + 2 * buf_elts + 7;
  int32_t *Dtl = buf + 3 * buf_elts + 7;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}